

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

_Bool pickoneauth(auth *pick,unsigned_long mask)

{
  _Bool _Var1;
  ulong uVar2;
  
  uVar2 = mask & pick->avail & pick->want;
  if ((uVar2 & 4) == 0) {
    if ((uVar2 & 0x40) == 0) {
      if ((uVar2 & 2) == 0) {
        if ((uVar2 & 8) == 0) {
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 1) == 0) {
              pick->picked = 0x40000000;
              _Var1 = false;
              goto LAB_0056c960;
            }
            pick->picked = 1;
          }
          else {
            pick->picked = 0x20;
          }
        }
        else {
          pick->picked = 8;
        }
      }
      else {
        pick->picked = 2;
      }
    }
    else {
      pick->picked = 0x40;
    }
  }
  else {
    pick->picked = 4;
  }
  _Var1 = true;
LAB_0056c960:
  pick->avail = 0;
  return _Var1;
}

Assistant:

static bool pickoneauth(struct auth *pick, unsigned long mask)
{
  bool picked;
  /* only deal with authentication we want */
  unsigned long avail = pick->avail & pick->want & mask;
  picked = TRUE;

  /* The order of these checks is highly relevant, as this will be the order
     of preference in case of the existence of multiple accepted types. */
  if(avail & CURLAUTH_NEGOTIATE)
    pick->picked = CURLAUTH_NEGOTIATE;
  else if(avail & CURLAUTH_BEARER)
    pick->picked = CURLAUTH_BEARER;
  else if(avail & CURLAUTH_DIGEST)
    pick->picked = CURLAUTH_DIGEST;
  else if(avail & CURLAUTH_NTLM)
    pick->picked = CURLAUTH_NTLM;
  else if(avail & CURLAUTH_NTLM_WB)
    pick->picked = CURLAUTH_NTLM_WB;
  else if(avail & CURLAUTH_BASIC)
    pick->picked = CURLAUTH_BASIC;
  else {
    pick->picked = CURLAUTH_PICKNONE; /* we select to use nothing */
    picked = FALSE;
  }
  pick->avail = CURLAUTH_NONE; /* clear it here */

  return picked;
}